

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

double ucurr_getRoundingIncrementForUsage_63(UChar *currency,UCurrencyUsage usage,UErrorCode *ec)

{
  bool bVar1;
  uint *puVar2;
  long lVar3;
  uint *puVar4;
  double dVar5;
  double dVar6;
  
  puVar2 = (uint *)_findMetaData(currency,ec);
  if (U_ZERO_ERROR < *ec) {
    return 0.0;
  }
  if (usage == UCURR_USAGE_STANDARD) {
    lVar3 = 4;
    puVar4 = puVar2;
  }
  else {
    if (usage != UCURR_USAGE_CASH) {
      *ec = U_UNSUPPORTED_ERROR;
      dVar6 = 0.0;
      bVar1 = false;
      goto LAB_002c9d6d;
    }
    lVar3 = 0xc;
    puVar4 = puVar2 + 2;
  }
  if ((ulong)*puVar4 < 10) {
    bVar1 = true;
    dVar6 = 0.0;
    if (1 < *(int *)((long)puVar2 + lVar3)) {
      dVar6 = (double)*(int *)((long)puVar2 + lVar3) / (double)POW10[*puVar4];
    }
  }
  else {
    *ec = U_INVALID_FORMAT_ERROR;
    bVar1 = true;
    dVar6 = 0.0;
  }
LAB_002c9d6d:
  dVar5 = 0.0;
  if (bVar1) {
    dVar5 = dVar6;
  }
  return dVar5;
}

Assistant:

U_DRAFT double U_EXPORT2
ucurr_getRoundingIncrementForUsage(const UChar* currency, const UCurrencyUsage usage, UErrorCode* ec) {
    double result = 0.0;

    const int32_t *data = _findMetaData(currency, *ec);
    if (U_SUCCESS(*ec)) {
        int32_t fracDigits;
        int32_t increment;
        switch (usage) {
            case UCURR_USAGE_STANDARD:
                fracDigits = data[0];
                increment = data[1];
                break;
            case UCURR_USAGE_CASH:
                fracDigits = data[2];
                increment = data[3];
                break;
            default:
                *ec = U_UNSUPPORTED_ERROR;
                return result;
        }

        // If the meta data is invalid, return 0.0
        if (fracDigits < 0 || fracDigits > MAX_POW10) {
            *ec = U_INVALID_FORMAT_ERROR;
        } else {
            // A rounding value of 0 or 1 indicates no rounding.
            if (increment >= 2) {
                // Return (increment) / 10^(fracDigits).  The only actual rounding data,
                // as of this writing, is CHF { 2, 5 }.
                result = double(increment) / POW10[fracDigits];
            }
        }
    }

    return result;
}